

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O2

void QGuiApplicationPrivate::processSafeAreaMarginsChangedEvent(SafeAreaMarginsChangedEvent *wse)

{
  QWindow *this;
  Data *pDVar1;
  bool bVar2;
  QWindow *pQVar3;
  QWindow *this_00;
  long in_FS_OFFSET;
  QMargins _t1;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QWeakPointer<QObject>::isNull(&(wse->window).wp);
  if (!bVar2) {
    pQVar3 = (QWindow *)0x0;
    this = (QWindow *)(wse->window).wp.value;
    this_00 = this;
    if ((((wse->window).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i == 0) {
      this_00 = pQVar3;
    }
    _t1 = QWindow::safeAreaMargins(this);
    QWindow::safeAreaMarginsChanged(this_00,_t1);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_38,SafeAreaMarginsChange);
    pDVar1 = (wse->window).wp.d;
    if (pDVar1 != (Data *)0x0) {
      if ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0) {
        pQVar3 = (QWindow *)0x0;
      }
      else {
        pQVar3 = (QWindow *)(wse->window).wp.value;
      }
    }
    QCoreApplication::sendSpontaneousEvent((QObject *)pQVar3,(QEvent *)&local_38);
    QEvent::~QEvent((QEvent *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::processSafeAreaMarginsChangedEvent(QWindowSystemInterfacePrivate::SafeAreaMarginsChangedEvent *wse)
{
    if (wse->window.isNull())
        return;

    emit wse->window->safeAreaMarginsChanged(wse->window->safeAreaMargins());

    QEvent event(QEvent::SafeAreaMarginsChange);
    QGuiApplication::sendSpontaneousEvent(wse->window, &event);
}